

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basewindow_x11.cc
# Opt level: O0

void __thiscall bgui::BaseWindow::getContent(BaseWindow *this,ImageU8 *image)

{
  int iVar1;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *pIVar2;
  uchar uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_RSI;
  long in_RDI;
  uint32_t v;
  int i;
  char *line;
  int k;
  int brs;
  int bls;
  int grs;
  int gls;
  int rrs;
  int rls;
  undefined4 in_stack_ffffffffffffffc0;
  uint32_t v_00;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar7;
  long in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar8;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *local_10;
  
  local_10 = in_RSI;
  anon_unknown_0::getShiftFromMask
            (*(unsigned_long *)(*(long *)(*(long *)(in_RDI + 8) + 0x40) + 0x38),&local_14,&local_18)
  ;
  anon_unknown_0::getShiftFromMask
            (*(unsigned_long *)(*(long *)(*(long *)(in_RDI + 8) + 0x40) + 0x40),&local_1c,&local_20)
  ;
  anon_unknown_0::getShiftFromMask
            (*(unsigned_long *)(*(long *)(*(long *)(in_RDI + 8) + 0x40) + 0x48),&local_24,&local_28)
  ;
  pthread_mutex_lock((pthread_mutex_t *)(*(long *)(in_RDI + 8) + 0xa0));
  gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
            ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8
             ,CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_RDI);
  for (iVar8 = 0; iVar8 < *(int *)(*(long *)(in_RDI + 8) + 0x4c); iVar8 = iVar8 + 1) {
    lVar4 = *(long *)(*(long *)(*(long *)(in_RDI + 8) + 0x40) + 0x10) +
            (long)(iVar8 * *(int *)(*(long *)(*(long *)(in_RDI + 8) + 0x40) + 0x2c));
    for (iVar7 = 0; pIVar2 = local_10, iVar7 < *(int *)(*(long *)(in_RDI + 8) + 0x48);
        iVar7 = iVar7 + 1) {
      v_00 = 0;
      iVar1 = *(int *)(*(long *)(*(long *)(in_RDI + 8) + 0x40) + 0x1c);
      if (iVar1 == 8) {
        v_00 = (uint32_t)*(byte *)(lVar4 + iVar7);
      }
      else if (iVar1 == 0x10) {
        v_00 = (uint32_t)*(ushort *)(lVar4 + (long)iVar7 * 2);
      }
      else if (iVar1 == 0x20) {
        v_00 = *(uint32_t *)(lVar4 + (long)iVar7 * 4);
      }
      lVar5 = (long)iVar7;
      lVar6 = (long)iVar8;
      uVar3 = anon_unknown_0::inverseShiftAndMaskValue
                        (v_00,local_14,local_18,
                         *(unsigned_long *)(*(long *)(*(long *)(in_RDI + 8) + 0x40) + 0x38));
      gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::set
                (pIVar2,lVar5,lVar6,0,uVar3);
      pIVar2 = local_10;
      lVar5 = (long)iVar7;
      lVar6 = (long)iVar8;
      uVar3 = anon_unknown_0::inverseShiftAndMaskValue
                        (v_00,local_1c,local_20,
                         *(unsigned_long *)(*(long *)(*(long *)(in_RDI + 8) + 0x40) + 0x40));
      gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::set
                (pIVar2,lVar5,lVar6,1,uVar3);
      pIVar2 = local_10;
      lVar5 = (long)iVar7;
      lVar6 = (long)iVar8;
      uVar3 = anon_unknown_0::inverseShiftAndMaskValue
                        (v_00,local_24,local_28,
                         *(unsigned_long *)(*(long *)(*(long *)(in_RDI + 8) + 0x40) + 0x48));
      gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::set
                (pIVar2,lVar5,lVar6,2,uVar3);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)(*(long *)(in_RDI + 8) + 0xa0));
  return;
}

Assistant:

void BaseWindow::getContent(gimage::ImageU8 &image)
{
  int rls, rrs;
  int gls, grs;
  int bls, brs;

  // store image in buffer

  getShiftFromMask(p->image->red_mask, rls, rrs);
  getShiftFromMask(p->image->green_mask, gls, grs);
  getShiftFromMask(p->image->blue_mask, bls, brs);

  pthread_mutex_lock(&(p->mutex));

  image.setSize(p->w, p->h, 3);

  for (int k=0; k<p->h; k++)
  {
    char *line=p->image->data+k*p->image->bytes_per_line;

    for (int i=0; i<p->w; i++)
    {
      uint32_t v=0;

      switch (p->image->bitmap_unit)
      {
        case 8:
          v=reinterpret_cast<uint8_t *>(line)[i];
          break;

        case 16:
          v=reinterpret_cast<uint16_t *>(line)[i];
          break;

        case 32:
          v=reinterpret_cast<uint32_t *>(line)[i];
          break;
      }

      image.set(i, k, 0, inverseShiftAndMaskValue(v, rls, rrs, p->image->red_mask));
      image.set(i, k, 1, inverseShiftAndMaskValue(v, gls, grs, p->image->green_mask));
      image.set(i, k, 2, inverseShiftAndMaskValue(v, bls, brs, p->image->blue_mask));
    }
  }

  pthread_mutex_unlock(&(p->mutex));
}